

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# opennurbs_math.cpp
# Opt level: O0

bool ON_EvTangent(ON_3dVector *D1,ON_3dVector *D2,ON_3dVector *T)

{
  ON_3dVector local_60;
  ON_3dVector local_48;
  double local_30;
  double d1;
  ON_3dVector *pOStack_20;
  bool rc;
  ON_3dVector *T_local;
  ON_3dVector *D2_local;
  ON_3dVector *D1_local;
  
  d1._7_1_ = 0;
  pOStack_20 = T;
  T_local = D2;
  D2_local = D1;
  local_30 = ON_3dVector::Length(D1);
  if ((local_30 != 0.0) || (NAN(local_30))) {
    ON_3dVector::operator/(&local_60,D2_local,local_30);
    pOStack_20->x = local_60.x;
    pOStack_20->y = local_60.y;
    pOStack_20->z = local_60.z;
    d1._7_1_ = 1;
  }
  else {
    local_30 = ON_3dVector::Length(T_local);
    if (local_30 <= 0.0) {
      pOStack_20->x = ON_3dVector::ZeroVector.x;
      pOStack_20->y = ON_3dVector::ZeroVector.y;
      pOStack_20->z = ON_3dVector::ZeroVector.z;
    }
    else {
      ON_3dVector::operator/(&local_48,T_local,local_30);
      pOStack_20->x = local_48.x;
      pOStack_20->y = local_48.y;
      pOStack_20->z = local_48.z;
      d1._7_1_ = 1;
    }
  }
  return (bool)(d1._7_1_ & 1);
}

Assistant:

bool ON_EvTangent( 
        const ON_3dVector& D1, // first derivative
        const ON_3dVector& D2, // second derivative
        ON_3dVector& T         // Unit tangent returned here
        )
{
  // Evaluate unit tangent from first and second derivatives
  // T = D1 / |D1|

  bool rc = false;
  double d1 = D1.Length();

  if (d1 == 0.0) 
  {
    // Use L'hopital's rule to show that if the unit tangent
    // exists and the 1rst derivative is zero and the 2nd derivative is
    // nonzero, then the unit tangent is equal to +/-the unitized 
    // 2nd derivative.  The sign is equal to the sign of D1(s) o D2(s)
    // as s approaches the evaluation parameter.
    //
    d1 = D2.Length();
    if (d1 > 0.0) 
    {
      T = D2/d1;
      rc = true;
    }
    else 
    {
      T = ON_3dVector::ZeroVector;
    }
  }
  else 
  {
    T = D1/d1;
    rc = true;
  }
  return rc;  
}